

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::absolute_pose::modules::p3p_kneip_main
               (bearingVectors_t *f,points_t *p,transformations_t *solutions)

{
  pointer *ppMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  pointer pMVar6;
  iterator __position;
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int i;
  long lVar26;
  ulong uVar27;
  double *pdVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double dVar64;
  double dVar72;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double dVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  double dVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  bearingVector_t f3;
  rotation_t T;
  transformation_t solution;
  DstEvaluatorType dstEvaluator;
  rotation_t R;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  vector<double,_std::allocator<double>_> realRoots;
  type tmp;
  rotation_t N;
  assign_op<double,_double> local_381;
  undefined1 local_380 [16];
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  undefined1 local_350 [16];
  double local_340 [6];
  undefined8 local_310;
  undefined8 local_308;
  double local_300;
  undefined8 uStack_2f8;
  double local_2f0 [2];
  Matrix<double,_3,_4,_0,_3,_4> local_2e0;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  double local_220;
  plainobjectbase_evaluator_data<double,_3> local_218;
  non_const_type local_210 [2];
  plainobjectbase_evaluator_data<double,_3> pStack_200;
  plainobjectbase_evaluator_data<double,_3> pStack_1f8;
  double dStack_1f0;
  undefined8 uStack_1e8;
  double dStack_1e0;
  double dStack_1d8;
  double local_1d0;
  undefined1 local_1c0 [16];
  double local_1b0 [4];
  undefined8 local_190;
  vector<double,_std::allocator<double>_> local_188;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_170;
  SrcEvaluatorType local_150;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined1 local_100 [16];
  ulong local_f0;
  ulong uStack_e8;
  undefined1 local_e0 [16];
  double local_d0;
  double dStack_c8;
  undefined1 local_c0 [16];
  double local_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pMVar6 = (p->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_100 = *(undefined1 (*) [16])
               &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data;
  auVar37 = *(undefined1 (*) [16])
             &pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data;
  auVar38 = *(undefined1 (*) [16])
             &pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
  local_368 = *(double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + 0x10);
  dVar57 = *(double *)
            ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  dVar59 = *(double *)
            ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array.
  _0_16_ = vsubpd_avx(auVar37,local_100);
  auVar29 = vsubpd_avx512vl(auVar38,local_100);
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       dVar59 - local_368;
  dVar79 = dVar57 - local_368;
  auVar39 = vshufpd_avx((undefined1  [16])
                        local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                        m_storage.m_data.array._0_16_,
                        (undefined1  [16])
                        local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                        m_storage.m_data.array._0_16_,1);
  dVar56 = auVar29._0_8_;
  auVar40 = vshufpd_avx(auVar29,auVar29,1);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar79;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2] * dVar56;
  auVar30 = vfmsub231sd_fma(auVar33,auVar41,
                            (undefined1  [16])
                            local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                            m_storage.m_data.array._0_16_);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar39._0_8_ * dVar79;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar31 = vfmsub231sd_fma(auVar31,auVar40,auVar34);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0] * auVar40._0_8_;
  auVar40 = vfmsub231sd_fma(auVar32,auVar29,auVar39);
  auVar39 = vunpcklpd_avx(auVar31,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       auVar40._0_8_ * auVar40._0_8_ + auVar39._0_8_ * auVar39._0_8_ + auVar39._8_8_ * auVar39._8_8_
  ;
  auVar39 = vsqrtsd_avx(auVar30,auVar30);
  if ((auVar39._0_8_ == 0.0) && (!NAN(auVar39._0_8_))) {
    return;
  }
  pMVar6 = (f->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  auVar39 = *(undefined1 (*) [16])
             &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data;
  dVar2 = *(double *)
           ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data + 0x10);
  local_300 = *(double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + 0x10);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_300;
  auVar40 = *(undefined1 (*) [16])
             &pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       *(double *)
        ((long)(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array + 8);
  dVar3 = *(double *)
           ((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data + 8);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar3;
  dVar74 = pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
  dVar4 = *(double *)
           ((long)pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array + 8);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar2;
  auVar30 = vmulsd_avx512f(auVar114,auVar39);
  local_340[2] = (double)vmovlpd_avx(auVar39);
  auVar30 = vfmsub231sd_avx512f(auVar30,auVar60,auVar40);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar3 * local_300;
  auVar31 = vfmsub231sd_avx512f(auVar111,auVar97,auVar114);
  auVar31 = vunpcklpd_avx512vl(auVar31,auVar30);
  auVar30 = vmulsd_avx512f(auVar40,auVar97);
  dVar64 = auVar31._0_8_ * auVar31._0_8_;
  dVar72 = auVar31._8_8_ * auVar31._8_8_;
  auVar32 = vfmsub231sd_avx512f(auVar30,auVar39,auVar94);
  auVar65._0_8_ = dVar64 + dVar72;
  auVar65._8_8_ = dVar64 + dVar72;
  auVar30 = vmulsd_avx512f(auVar32,auVar32);
  auVar30 = vaddsd_avx512f(auVar30,auVar65);
  auVar66._0_8_ = auVar30._0_8_;
  auVar66._8_8_ = 0;
  auVar30 = vsqrtpd_avx(auVar66);
  auVar33 = vmovddup_avx512vl(auVar30);
  auVar30 = vdivsd_avx512f(auVar32,auVar30);
  auVar31 = vdivpd_avx512vl(auVar31,auVar33);
  auVar32 = vmulsd_avx512f(auVar97,auVar30);
  auVar33 = vshufpd_avx512vl(auVar31,auVar31,1);
  auVar34 = vmulsd_avx512f(auVar60,auVar31);
  auVar35 = vmulsd_avx512f(auVar39,auVar33);
  auVar32 = vfmsub231sd_avx512f(auVar32,auVar33,auVar60);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar4;
  auVar33 = vmulsd_avx512f(auVar33,auVar36);
  auVar34 = vfmsub231sd_avx512f(auVar34,auVar30,auVar39);
  auVar36 = vfmsub231sd_avx512f(auVar35,auVar31,auVar97);
  vmovsd_avx512f(auVar32);
  local_340[4] = auVar31._0_8_;
  dVar64 = auVar39._8_8_;
  vmovsd_avx512f(auVar34);
  vmovsd_avx512f(auVar36);
  local_308 = vmovhpd_avx(auVar31);
  local_2f0[0] = auVar30._0_8_;
  auVar44._8_8_ = local_340[3];
  auVar44._0_8_ = local_340[2];
  auVar45._8_8_ = local_310;
  auVar45._0_8_ = dVar64;
  auVar42._8_8_ = dVar74;
  auVar42._0_8_ = dVar74;
  auVar31 = vmulpd_avx512vl(auVar44,auVar42);
  auVar43._8_8_ = dVar4;
  auVar43._0_8_ = dVar4;
  auVar31 = vfmadd132pd_avx512vl(auVar45,auVar31,auVar43);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  auVar32 = vmovddup_avx512vl(auVar35);
  auVar46._8_8_ = uStack_2f8;
  auVar46._0_8_ = local_300;
  local_380 = vfmadd231pd_avx512vl(auVar31,auVar32,auVar46);
  auVar30 = vmulsd_avx512f(auVar32,auVar30);
  auVar30 = vaddsd_avx512f(auVar33,auVar30);
  local_370 = local_340[4] * dVar74 + auVar30._0_8_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar2;
  dVar74 = auVar40._0_8_;
  auVar30 = auVar29;
  local_340[5] = dVar64;
  if (0.0 < local_370) {
    dVar72 = *(double *)
              ((long)pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 8);
    dVar4 = pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_300 * dVar74;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = dVar2;
    auVar31 = vfmsub231sd_avx512f(auVar105,auVar116,auVar39);
    dVar2 = *(double *)
             ((long)&pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data + 0x10);
    vmovsd_avx512f(auVar116);
    auVar30 = vmulsd_avx512f(auVar97,auVar116);
    auVar30 = vfmsub231sd_fma(auVar30,auVar94,auVar60);
    auVar31 = vunpcklpd_avx(auVar30,auVar31);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar3 * auVar39._0_8_;
    auVar41 = vfmsub231sd_fma(auVar106,auVar40,auVar97);
    dVar104 = auVar41._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ =
         dVar104 * dVar104 + auVar31._0_8_ * auVar31._0_8_ + auVar31._8_8_ * auVar31._8_8_;
    auVar30 = vsqrtpd_avx(auVar98);
    dVar96 = auVar30._0_8_;
    auVar112._8_8_ = dVar96;
    auVar112._0_8_ = dVar96;
    auVar99._0_8_ = dVar104 / dVar96;
    auVar99._8_8_ = auVar41._8_8_;
    auVar31 = vdivpd_avx(auVar31,auVar112);
    auVar41 = vshufpd_avx(auVar31,auVar31,1);
    auVar30 = vmulsd_avx512f(auVar115,auVar31);
    auVar32 = vmulsd_avx512f(auVar40,auVar41);
    auVar113._8_8_ = 0;
    auVar113._0_8_ = dVar3 * auVar99._0_8_;
    auVar33 = vfmsub231sd_avx512f(auVar113,auVar41,auVar115);
    auVar30 = vfmsub231sd_avx512f(auVar30,auVar99,auVar40);
    auVar32 = vfmsub231sd_avx512f(auVar32,auVar31,auVar94);
    local_340[3] = auVar33._0_8_;
    vmovsd_avx512f(auVar30);
    vmovsd_avx512f(auVar32);
    local_340[4] = (double)vmovlpd_avx(auVar31);
    local_308 = vmovhpd_avx(auVar31);
    auVar82._0_8_ = dVar4 * dVar74;
    auVar82._8_8_ = dVar4 * local_340[3];
    auVar16._8_8_ = local_310;
    auVar16._0_8_ = dVar3;
    auVar9._8_8_ = dVar72;
    auVar9._0_8_ = dVar72;
    auVar30 = vfmadd132pd_avx512vl(auVar16,auVar82,auVar9);
    auVar83._8_8_ = dVar2;
    auVar83._0_8_ = dVar2;
    auVar17._8_8_ = uStack_2f8;
    auVar17._0_8_ = local_300;
    local_380 = vfmadd231pd_fma(auVar30,auVar83,auVar17);
    auVar30 = vsubpd_avx512vl(local_100,auVar38);
    local_370 = auVar41._0_8_ * dVar72 + dVar2 * auVar99._0_8_ +
                auVar31._0_8_ *
                pMVar6[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_368 - dVar57;
    local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = dVar59 - dVar57;
    local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array.
    _0_16_ = vsubpd_avx512vl(auVar37,auVar38);
    local_100 = auVar38;
    local_368 = dVar57;
    local_340[2] = dVar74;
    local_340[5] = dVar3;
    local_2f0[0] = auVar99._0_8_;
  }
  dVar59 = auVar41._0_8_;
  auVar32 = vsubpd_avx512vl(auVar37,local_100);
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       (double)&local_a0;
  auVar38 = vshufpd_avx(auVar32,auVar32,1);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar59 * dVar59 + auVar30._0_8_ * auVar30._0_8_ + auVar30._8_8_ * auVar30._8_8_;
  auVar37 = vsqrtpd_avx(auVar67);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar79 * dVar79 + dVar56 * dVar56 + auVar29._8_8_ * auVar29._8_8_;
  local_230 = vsqrtpd_avx(auVar48);
  dVar57 = auVar37._0_8_;
  auVar80._8_8_ = dVar57;
  auVar80._0_8_ = dVar57;
  auVar68._0_8_ = dVar59 / dVar57;
  auVar68._8_8_ = auVar41._8_8_;
  auVar37 = vdivpd_avx(auVar30,auVar80);
  local_340[0] = (double)local_380._0_8_ / local_370;
  auVar30 = vshufpd_avx(auVar37,auVar37,1);
  local_a0 = (double)vmovlpd_avx(auVar37);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = auVar38._0_8_ * auVar68._0_8_;
  auVar31 = vfmsub231sd_fma(auVar95,auVar30,auVar90);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2] * auVar37._0_8_;
  auVar29 = vfmsub231sd_fma(auVar100,auVar68,auVar32);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auVar30._0_8_ * auVar32._0_8_;
  auVar41 = vfmsub231sd_fma(auVar76,auVar37,auVar38);
  local_340[1] = 0.0;
  auVar31 = vunpcklpd_avx(auVar31,auVar29);
  dVar57 = auVar41._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar57 * dVar57 + auVar31._0_8_ * auVar31._0_8_ + auVar31._8_8_ * auVar31._8_8_;
  auVar38 = vsqrtpd_avx(auVar91);
  dVar59 = auVar38._0_8_;
  auVar101._8_8_ = dVar59;
  auVar101._0_8_ = dVar59;
  auVar77._0_8_ = dVar57 / dVar59;
  auVar77._8_8_ = auVar41._8_8_;
  auVar38 = vdivpd_avx(auVar31,auVar101);
  auVar31 = vshufpd_avx(auVar38,auVar38,1);
  local_90 = auVar38._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar30._0_8_ * auVar77._0_8_;
  auVar29 = vfmsub231sd_fma(auVar102,auVar31,auVar68);
  dStack_88 = auVar37._8_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_90 * auVar68._0_8_;
  auVar41 = vfmsub231sd_fma(auVar107,auVar77,auVar37);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = auVar31._0_8_ * auVar37._0_8_;
  auVar37 = vfmsub231sd_fma(auVar92,auVar38,auVar30);
  dStack_98 = auVar29._0_8_;
  local_80 = auVar41._0_8_;
  dStack_68 = auVar37._0_8_;
  local_78 = (double)vmovhpd_avx(auVar38);
  auVar69._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0] * local_a0;
  auVar69._8_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0] * dStack_98;
  auVar29._8_8_ = local_80;
  auVar29._0_8_ = dStack_88;
  auVar22._8_8_ = dStack_68;
  auVar22._0_8_ = auVar68._0_8_;
  auVar37._8_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  auVar37._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  auVar37 = vfmadd132pd_avx512vl(auVar29,auVar69,auVar37);
  auVar38._8_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar38._0_8_ =
       local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  local_260 = vfmadd132pd_avx512vl(auVar22,auVar37,auVar38);
  local_360 = (double)local_380._8_8_ / local_370;
  auVar38 = ZEXT816(0);
  local_1c0 = vshufpd_avx(local_260,local_260,1);
  auVar37 = vmulsd_avx512f(auVar60,auVar115);
  dVar57 = auVar37._0_8_ + auVar39._0_8_ * dVar74 + dVar64 * auVar40._8_8_;
  dVar59 = 1.0 / (1.0 - dVar57 * dVar57) + -1.0;
  local_70 = auVar68._0_8_;
  local_60 = auVar77._0_8_;
  if (dVar59 < 0.0) {
    local_350._0_8_ = dVar57;
    auVar53._0_8_ = sqrt(dVar59);
    auVar53._8_56_ = extraout_var;
    auVar37 = auVar53._0_16_;
    auVar38 = ZEXT816(0) << 0x40;
    dVar57 = (double)local_350._0_8_;
  }
  else {
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar59;
    auVar37 = vsqrtsd_avx(auVar39,auVar39);
  }
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar57;
  uVar7 = vcmpsd_avx512f(auVar61,auVar38,1);
  bVar8 = (bool)((byte)uVar7 & 1);
  auVar40._8_8_ = 0x8000000000000000;
  auVar40._0_8_ = 0x8000000000000000;
  auVar38 = vxorpd_avx512vl(auVar37,auVar40);
  auVar14._8_8_ = local_340[1];
  auVar14._0_8_ = local_340[0];
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       0.0;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_360;
  auVar39 = vmulsd_avx512f(auVar117,auVar117);
  auVar40 = vmulsd_avx512f(local_1c0,local_1c0);
  local_250._0_8_ = (double)((ulong)bVar8 * auVar38._0_8_ + (ulong)!bVar8 * auVar37._0_8_);
  local_250._8_8_ = auVar37._8_8_;
  auVar30 = vmulsd_avx512f(local_230,local_230);
  auVar31 = vmulsd_avx512f(local_260,local_260);
  auVar37 = vaddsd_avx512f(auVar14,auVar14);
  auVar29 = vmulsd_avx512f(auVar14,auVar14);
  auVar41 = vaddsd_avx512f(local_260,local_260);
  auVar38 = vmulsd_avx512f(local_1c0,auVar40);
  auVar32 = vaddsd_avx512f(auVar39,auVar39);
  auVar33 = vmulsd_avx512f(auVar40,auVar39);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_360;
  auVar37 = vmulsd_avx512f(auVar37,auVar118);
  auVar34 = vmulsd_avx512f(auVar41,auVar40);
  auVar36 = vmulsd_avx512f(local_260,auVar31);
  auVar35 = vmulsd_avx512f(auVar38,auVar32);
  dVar57 = auVar38._0_8_;
  auVar42 = vmulsd_avx512f(local_1c0,auVar38);
  auVar37 = vmulsd_avx512f(local_260,auVar37);
  auVar43 = vmulsd_avx512f(local_260,auVar36);
  auVar35 = vmulsd_avx512f(local_230,auVar35);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar57 + dVar57;
  auVar44 = vmulsd_avx512f(local_230,auVar93);
  auVar37 = vmulsd_avx512f(auVar40,auVar37);
  auVar38 = vmulsd_avx512f(auVar29,auVar42);
  auVar45 = vmulsd_avx512f(local_230,auVar37);
  auVar38 = vfnmsub231sd_fma(auVar38,auVar39,auVar42);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar35._0_8_ * local_250._0_8_;
  auVar37 = vfmadd231sd_fma(auVar103,local_250,auVar44);
  auVar44 = vaddsd_avx512f(auVar118,auVar118);
  local_1b0[0] = auVar38._0_8_ - auVar42._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar57 * auVar44._0_8_;
  auVar38 = vmulsd_avx512f(auVar14,auVar84);
  auVar44 = vmulsd_avx512f(auVar30,auVar33);
  auVar37 = vfnmadd231sd_avx512f(auVar37,auVar38,local_230);
  auVar38 = vmulsd_avx512f(local_230,auVar38);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar44._0_8_ * local_250._0_8_ * local_250._0_8_;
  auVar46 = vfnmsub231sd_avx512f(auVar108,auVar33,auVar31);
  local_1b0[1] = auVar37._0_8_;
  auVar37 = vfnmadd231sd_avx512f(auVar46,auVar33,auVar30);
  auVar37 = vfmadd231sd_fma(auVar37,auVar39,auVar42);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar29,auVar42);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar34,local_230);
  auVar37 = vfmadd213sd_avx512f(auVar45,local_250,auVar37);
  dVar57 = auVar31._0_8_;
  dVar59 = auVar40._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar57 * dVar59;
  auVar37 = vfnmadd213sd_avx512f(auVar109,auVar29,auVar37);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar34._0_8_ * auVar39._0_8_;
  auVar37 = vfmadd213sd_avx512f(auVar86,local_230,auVar37);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_250._0_8_ * local_250._0_8_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = auVar30._0_8_ * dVar59;
  auVar37 = vfnmadd213sd_fma(auVar110,auVar70,auVar37);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar57 + dVar57;
  auVar37 = vfnmadd231sd_fma(auVar37,auVar87,auVar40);
  auVar39 = vmulsd_avx512f(local_1c0,auVar87);
  auVar39 = vmulsd_avx512f(local_230,auVar39);
  local_1b0[2] = auVar37._0_8_;
  auVar37 = vfmadd231sd_fma(auVar38,local_250,auVar39);
  auVar38 = vmulsd_avx512f(local_1c0,auVar41);
  auVar37 = vfnmadd231sd_fma(auVar37,local_250,auVar35);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = auVar38._0_8_ * auVar30._0_8_;
  auVar37 = vfnmadd213sd_fma(auVar88,local_250,auVar37);
  local_1b0[3] = auVar37._0_8_;
  auVar37 = vmulsd_avx512f(auVar118,ZEXT816(0xc000000000000000));
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar37._0_8_ * dVar59;
  auVar37 = vmulsd_avx512f(auVar14,auVar89);
  auVar37 = vmulsd_avx512f(local_260,auVar37);
  auVar37 = vmulsd_avx512f(local_230,auVar37);
  auVar37 = vfmadd213sd_fma(auVar37,local_250,auVar44);
  auVar38 = vmulsd_avx512f(auVar40,auVar29);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = auVar36._0_8_ + auVar36._0_8_;
  auVar37 = vfmadd213sd_avx512f(auVar75,local_230,auVar37);
  auVar37 = vfnmadd231sd_fma(auVar37,auVar31,auVar30);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar31,auVar33);
  auVar39 = vmulsd_avx512f(auVar40,auVar32);
  auVar39 = vmulsd_avx512f(local_260,auVar39);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar37._0_8_ - auVar43._0_8_;
  auVar37 = vfnmadd213sd_avx512f(auVar39,local_230,auVar73);
  auVar37 = vfmadd213sd_fma(auVar38,auVar31,auVar37);
  auVar37 = vfmadd231sd_fma(auVar37,auVar44,auVar70);
  local_190 = auVar37._0_8_;
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_2e0,5,5,1);
  if ((local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1] == 2.47032822920623e-323) &&
     (local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [2] == 4.94065645841247e-324)) {
    uVar27 = 5;
    uVar25 = 0;
    pdVar28 = (double *)
              local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array[0];
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_2e0,5,5,1);
    pdVar28 = (double *)
              local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array[0];
    uVar27 = (long)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2] *
             (long)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[1];
    uVar25 = uVar27 + 7;
    if (-1 < (long)uVar27) {
      uVar25 = uVar27;
    }
    uVar25 = uVar25 & 0xfffffffffffffff8;
    if (7 < (long)uVar27) {
      uVar23 = 8;
      if (8 < (long)uVar25) {
        uVar23 = uVar25;
      }
      memcpy((void *)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[0],local_1b0,uVar23 * 8);
    }
    if ((long)uVar27 <= (long)uVar25) goto LAB_00150b1a;
  }
  memcpy(pdVar28 + uVar25,local_1b0 + uVar25,(uVar27 - uVar25) * 8);
LAB_00150b1a:
  math::o4_roots(&local_188,(MatrixXd *)&local_2e0);
  if ((double *)
      local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [0] != (double *)0x0) {
    free(*(void **)((long)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                          m_storage.m_data.array[0] + -8));
  }
  auVar15._8_8_ = local_340[1];
  auVar15._0_8_ = local_340[0];
  lVar26 = 0;
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  local_e0 = vxorpd_avx512vl(auVar15,auVar10);
  local_f0 = 0x8000000000000000;
  uStack_e8 = 0x8000000000000000;
  local_220 = (local_e0._0_8_ * (double)local_260._0_8_) / local_360;
  do {
    local_340[0] = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar26];
    dVar57 = 1.0 - local_340[0] * local_340[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar57;
    if (dVar57 < 0.0) {
      auVar54._0_8_ = sqrt(dVar57);
      auVar54._8_56_ = extraout_var_00;
      local_350 = auVar54._0_16_;
    }
    else {
      local_350 = vsqrtsd_avx(auVar49,auVar49);
    }
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_340[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_220;
    auVar37 = vfnmadd213sd_fma(local_1c0,auVar78,auVar5);
    auVar37 = vfmadd231sd_fma(auVar37,local_230,local_250);
    auVar62._0_8_ =
         auVar37._0_8_ /
         (((local_1c0._0_8_ * local_340[0] * (double)local_e0._0_8_) / local_360 +
          (double)local_260._0_8_) - local_230._0_8_);
    auVar62._8_8_ = auVar37._8_8_;
    auVar50._0_8_ = 1.0 / (auVar62._0_8_ * auVar62._0_8_ + 1.0);
    auVar50._8_8_ = 0;
    local_240 = vsqrtsd_avx(auVar50,auVar50);
    dVar57 = 1.0 - local_240._0_8_ * local_240._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar57;
    if (dVar57 < 0.0) {
      local_358 = auVar62._0_8_;
      auVar55._0_8_ = sqrt(dVar57);
      auVar55._8_56_ = extraout_var_01;
      auVar37 = auVar55._0_16_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_358;
      auVar38 = local_350;
    }
    else {
      auVar37 = vsqrtsd_avx(auVar51,auVar51);
      auVar38 = local_350;
    }
    uVar7 = vcmpsd_avx512f(auVar62,ZEXT816(0),1);
    bVar8 = (bool)((byte)uVar7 & 1);
    local_150.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.m_matrix = (non_const_type)&local_a0;
    local_170.m_dst = (DstEvaluatorType *)&local_218;
    local_150.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_innerDim = 3;
    local_170.m_src = &local_150;
    local_170.m_functor = &local_381;
    auVar47._0_8_ =
         (double)((ulong)bVar8 * (auVar37._0_8_ ^ local_f0) + (ulong)!bVar8 * auVar37._0_8_);
    auVar47._8_8_ = auVar37._8_8_;
    auVar39 = vfmadd213sd_fma(local_250,local_240,auVar47);
    auVar52._0_8_ = (double)((ulong)auVar47._0_8_ ^ local_f0);
    auVar52._8_8_ = auVar37._8_8_ ^ uStack_e8;
    local_210[0] = (non_const_type)vmovlpd_avx(auVar52);
    local_210[1] = local_240._0_8_;
    local_350._0_8_ = auVar39._0_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (double)local_230._0_8_ * auVar47._0_8_ * (double)local_350._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         (double)local_210[1] * (double)local_230._0_8_ * local_340[0] * (double)local_350._0_8_;
    auVar37 = vunpcklpd_avx(auVar63,auVar71);
    dVar79 = auVar38._0_8_;
    dVar57 = auVar37._0_8_;
    local_d0 = dVar57 * dStack_88;
    dVar59 = auVar37._8_8_;
    dStack_c8 = dVar59 * local_80;
    local_350._0_8_ =
         (double)local_210[1] * (double)local_230._0_8_ * dVar79 * (double)local_350._0_8_;
    local_b0 = dVar57 * local_a0;
    dStack_a8 = dVar59 * dStack_98;
    local_350._8_8_ = 0;
    auVar21._8_8_ = dStack_88;
    auVar21._0_8_ = local_90;
    local_c0 = vmovhps_avx(auVar21,local_78);
    local_240._8_8_ = dVar59 * dStack_68;
    local_240._0_8_ = dVar57 * local_70;
    local_358 = (double)local_350._0_8_ * local_60;
    pStack_1f8.data = (double *)(local_340[0] * (double)((ulong)local_210[1] ^ local_f0));
    dStack_1e0 = dVar79 * (double)((ulong)local_210[1] ^ local_f0);
    dStack_1f0 = local_340[0] * auVar52._0_8_;
    dStack_1d8 = dVar79 * auVar52._0_8_;
    auVar58._0_8_ = (ulong)dVar79 ^ local_f0;
    auVar58._8_8_ = auVar38._8_8_ ^ uStack_e8;
    pStack_200.data = (double *)0x0;
    uStack_1e8 = vmovlpd_avx(auVar58);
    local_218.data = (double *)&local_2e0;
    local_1d0 = local_340[0];
    local_170.m_dstExpr = (DstXprType *)&local_2e0;
    local_150.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhs.m_matrix = (non_const_type)local_210;
    local_150.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
              )local_150.
               super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.m_matrix;
    local_150.
    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_rhsImpl.
    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
    data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
              )local_210;
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run(&local_170);
    auVar18._8_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar18._0_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[2];
    auVar19._8_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[4];
    auVar19._0_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar20._8_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[7];
    auVar20._0_8_ =
         local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[6];
    lVar24 = 0x10;
    auVar37 = vmovhpd_avx(auVar18,local_2e0.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                                  m_storage.m_data.array[5]);
    local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9]
         = local_b0 + dStack_a8 + (double)local_350._0_8_ * (double)local_c0._0_8_ +
           (double)local_100._0_8_;
    local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [10] = local_d0 + dStack_c8 + (double)local_350._0_8_ * (double)local_c0._8_8_ +
           (double)local_100._8_8_;
    do {
      auVar11._8_8_ = *(undefined8 *)((long)local_340 + lVar24);
      auVar11._0_8_ = *(undefined8 *)((long)local_340 + lVar24);
      auVar38 = vmulpd_avx512vl((undefined1  [16])
                                local_2e0.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                                m_storage.m_data.array._0_16_,auVar11);
      dVar57 = *(double *)((long)local_340 + lVar24 + 0x10);
      auVar81._8_8_ = dVar57;
      auVar81._0_8_ = dVar57;
      uVar7 = *(undefined8 *)((long)local_340 + lVar24 + 8);
      auVar12._8_8_ = uVar7;
      auVar12._0_8_ = uVar7;
      auVar38 = vfmadd231pd_avx512vl(auVar38,auVar19,auVar12);
      auVar38 = vfmadd231pd_fma(auVar38,auVar20,auVar81);
      *(undefined1 (*) [16])((long)&local_170.m_functor + lVar24) = auVar38;
      auVar85._0_8_ = auVar37._0_8_ * *(double *)((long)local_340 + lVar24);
      auVar85._8_8_ = auVar37._8_8_ * *(double *)((long)local_340 + lVar24 + 8);
      auVar38 = vshufpd_avx(auVar85,auVar85,1);
      *(double *)
       ((long)&local_150.
               super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.m_matrix + lVar24) =
           auVar85._0_8_ +
           auVar38._0_8_ +
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8] * dVar57;
      lVar24 = lVar24 + 0x18;
    } while (lVar24 != 0x58);
    lVar24 = 0x10;
    local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0xb] = (double)local_240._0_8_ + (double)local_240._8_8_ + local_358 + local_368;
    local_210[0] = local_150.
                   super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.m_matrix;
    local_210[1] = local_150.
                   super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_rhs.m_matrix;
    pStack_200.data =
         (double *)
         local_150.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhsImpl.
         super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
         .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
         m_d.data;
    pStack_1f8.data =
         (double *)
         local_150.
         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_rhsImpl.
         super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
         .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
         m_d.data;
    dStack_1f0 = (double)local_150.
                         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         .m_innerDim;
    uStack_1e8 = uStack_128;
    dStack_1e0 = (double)uStack_120;
    dStack_1d8 = (double)uStack_118;
    local_1d0 = (double)local_110;
    do {
      uVar13 = *(undefined8 *)((long)&local_218.data + lVar24);
      uVar7 = *(undefined8 *)((long)local_210 + lVar24);
      *(undefined8 *)((long)local_2f0 + lVar24) = *(undefined8 *)((long)&local_220 + lVar24);
      *(undefined8 *)((long)local_2f0 + lVar24 + 8) = uVar13;
      *(undefined8 *)
       ((long)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array + lVar24) = uVar7;
      lVar24 = lVar24 + 0x18;
    } while (lVar24 != 0x58);
    __position._M_current =
         (solutions->
         super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (solutions->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                  *)solutions,__position,&local_2e0);
    }
    else {
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[4] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[5] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[6] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[7] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[8] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[9] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[9];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[10] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[0xb] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0xb];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[0] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[1] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[2] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[3] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[4] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[5] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[6] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      m_storage.m_data.array[7] =
           local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
      ppMVar1 = &(solutions->
                 super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 4);
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_kneip_main(
    const bearingVectors_t & f,
    const points_t & p,
    transformations_t & solutions )
{
  point_t P1 = p[0];
  point_t P2 = p[1];
  point_t P3 = p[2];

  Eigen::Vector3d temp1 = P2 - P1;
  Eigen::Vector3d temp2 = P3 - P1;

  if( temp1.cross(temp2).norm() == 0)
    return;

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  Eigen::Vector3d e1 = f1;
  Eigen::Vector3d e3 = f1.cross(f2);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  f3 = T*f3;

  if( f3(2,0) > 0)
  {
    f1 = f[1];
    f2 = f[0];
    f3 = f[2];

    e1 = f1;
    e3 = f1.cross(f2);
    e3 = e3/e3.norm();
    e2 = e3.cross(e1);

    T.row(0) = e1.transpose();
    T.row(1) = e2.transpose();
    T.row(2) = e3.transpose();

    f3 = T*f3;

    P1 = p[1];
    P2 = p[0];
    P3 = p[2];
  }

  Eigen::Vector3d n1 = P2-P1;
  n1 = n1/n1.norm();
  Eigen::Vector3d n3 = n1.cross(P3-P1);
  n3 = n3/n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  P3 = N*(P3-P1);

  double d_12 = temp1.norm();
  double f_1 = f3(0,0)/f3(2,0);
  double f_2 = f3(1,0)/f3(2,0);
  double p_1 = P3(0,0);
  double p_2 = P3(1,0);

  double cos_beta = f1.dot(f2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double f_1_pw2 = pow(f_1,2);
  double f_2_pw2 = pow(f_2,2);
  double p_1_pw2 = pow(p_1,2);
  double p_1_pw3 = p_1_pw2 * p_1;
  double p_1_pw4 = p_1_pw3 * p_1;
  double p_2_pw2 = pow(p_2,2);
  double p_2_pw3 = p_2_pw2 * p_2;
  double p_2_pw4 = p_2_pw3 * p_2;
  double d_12_pw2 = pow(d_12,2);
  double b_pw2 = pow(b,2);

  Eigen::Matrix<double,5,1> factors;

  factors(0,0) = -f_2_pw2*p_2_pw4
                 -p_2_pw4*f_1_pw2
                 -p_2_pw4;

  factors(1,0) = 2*p_2_pw3*d_12*b
                 +2*f_2_pw2*p_2_pw3*d_12*b
                 -2*f_2*p_2_pw3*f_1*d_12;

  factors(2,0) = -f_2_pw2*p_2_pw2*p_1_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2*b_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw4
                 +p_2_pw4*f_1_pw2
                 +2*p_1*p_2_pw2*d_12
                 +2*f_1*f_2*p_1*p_2_pw2*d_12*b
                 -p_2_pw2*p_1_pw2*f_1_pw2
                 +2*p_1*p_2_pw2*f_2_pw2*d_12
                 -p_2_pw2*d_12_pw2*b_pw2
                 -2*p_1_pw2*p_2_pw2;

  factors(3,0) = 2*p_1_pw2*p_2*d_12*b
                 +2*f_2*p_2_pw3*f_1*d_12
                 -2*f_2_pw2*p_2_pw3*d_12*b
                 -2*p_1*p_2*d_12_pw2*b;

  factors(4,0) = -2*f_2*p_2_pw2*f_1*p_1*d_12*b
                 +f_2_pw2*p_2_pw2*d_12_pw2
                 +2*p_1_pw3*d_12
                 -p_1_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw2*p_1_pw2
                 -p_1_pw4
                 -2*f_2_pw2*p_2_pw2*p_1*d_12
                 +p_2_pw2*f_1_pw2*p_1_pw2
                 +f_2_pw2*p_2_pw2*d_12_pw2*b_pw2;

  std::vector<double> realRoots = math::o4_roots(factors);

  for( int i = 0; i < 4; i++ )
  {
    double cot_alpha =
        (-f_1*p_1/f_2-realRoots[i]*p_2+d_12*b)/
        (-f_1*realRoots[i]*p_2/f_2+p_1-d_12);

    double cos_theta = realRoots[i];
    double sin_theta = sqrt(1-pow(realRoots[i],2));
    double sin_alpha = sqrt(1/(pow(cot_alpha,2)+1));
    double cos_alpha = sqrt(1-pow(sin_alpha,2));

    if (cot_alpha < 0)
      cos_alpha = -cos_alpha;

    translation_t C;
    C(0,0) = d_12*cos_alpha*(sin_alpha*b+cos_alpha);
    C(1,0) = cos_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);
    C(2,0) = sin_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);

    C = P1 + N.transpose()*C;

    rotation_t R;
    R(0,0) = -cos_alpha;
    R(0,1) = -sin_alpha*cos_theta;
    R(0,2) = -sin_alpha*sin_theta;
    R(1,0) = sin_alpha;
    R(1,1) = -cos_alpha*cos_theta;
    R(1,2) = -cos_alpha*sin_theta;
    R(2,0) = 0.0;
    R(2,1) = -sin_theta;
    R(2,2) = cos_theta;

    R = N.transpose()*R.transpose()*T;

    transformation_t solution;
    solution.col(3) = C;
    solution.block<3,3>(0,0) = R;

    solutions.push_back(solution);
  }
}